

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void __thiscall FRemapTable::MakeIdentity(FRemapTable *this)

{
  ulong uVar1;
  long lVar2;
  
  for (lVar2 = 0; uVar1 = (ulong)this->NumEntries, lVar2 < (long)uVar1; lVar2 = lVar2 + 1) {
    this->Remap[lVar2] = (BYTE)lVar2;
  }
  for (lVar2 = 0; lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
    this->Palette[lVar2].field_0 = GPalette.BaseColors[lVar2].field_0;
    uVar1 = (ulong)(uint)this->NumEntries;
  }
  for (lVar2 = 1; lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
    this->Palette[lVar2].field_0.field_0.a = 0xff;
    uVar1 = (ulong)(uint)this->NumEntries;
  }
  return;
}

Assistant:

void FRemapTable::MakeIdentity()
{
	int i;

	for (i = 0; i < NumEntries; ++i)
	{
		Remap[i] = i;
	}
	for (i = 0; i < NumEntries; ++i)
	{
		Palette[i] = GPalette.BaseColors[i];
	}
	for (i = 1; i < NumEntries; ++i)
	{
		Palette[i].a = 255;
	}
}